

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewOrderSingle.h
# Opt level: O1

MsgType * FIX43::NewOrderSingle::MsgType(void)

{
  MsgType *in_RDI;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"D","");
  (in_RDI->super_StringField).super_FieldBase._vptr_FieldBase =
       (_func_int **)&PTR__FieldBase_00161cc0;
  (in_RDI->super_StringField).super_FieldBase.m_tag = 0x23;
  (in_RDI->super_StringField).super_FieldBase.m_string._M_dataplus._M_p =
       (pointer)&(in_RDI->super_StringField).super_FieldBase.m_string.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(in_RDI->super_StringField).super_FieldBase.m_string,local_38,
             local_30 + (long)local_38);
  (in_RDI->super_StringField).super_FieldBase.m_data._M_dataplus._M_p =
       (pointer)&(in_RDI->super_StringField).super_FieldBase.m_data.field_2;
  (in_RDI->super_StringField).super_FieldBase.m_data._M_string_length = 0;
  (in_RDI->super_StringField).super_FieldBase.m_data.field_2._M_local_buf[0] = '\0';
  (in_RDI->super_StringField).super_FieldBase.m_metrics.m_length = 0;
  (in_RDI->super_StringField).super_FieldBase.m_metrics.m_checksum = 0;
  (in_RDI->super_StringField).super_FieldBase._vptr_FieldBase =
       (_func_int **)&PTR__FieldBase_00161c40;
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return in_RDI;
}

Assistant:

static FIX::MsgType MsgType() { return FIX::MsgType("D"); }